

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O0

vector<char8_t,_std::allocator<char8_t>_> * __thiscall
RandomWordTestData<char8_t,_std::vector<char8_t,_std::allocator<char8_t>_>_>::get_remainder
          (vector<char8_t,_std::allocator<char8_t>_> *__return_storage_ptr__,
          RandomWordTestData<char8_t,_std::vector<char8_t,_std::allocator<char8_t>_>_> *this,
          size_t in_times_split)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  iterator __last;
  __normal_iterator<char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_> local_50;
  __normal_iterator<char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_> local_48;
  __normal_iterator<char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_> local_40;
  const_iterator local_38;
  value_type local_30;
  value_type index;
  ulong local_20;
  size_t in_times_split_local;
  RandomWordTestData<char8_t,_std::vector<char8_t,_std::allocator<char8_t>_>_> *this_local;
  vector<char8_t,_std::allocator<char8_t>_> *result;
  
  index._7_1_ = 0;
  local_20 = in_times_split;
  in_times_split_local = (size_t)this;
  this_local = (RandomWordTestData<char8_t,_std::vector<char8_t,_std::allocator<char8_t>_>_> *)
               __return_storage_ptr__;
  std::vector<char8_t,_std::allocator<char8_t>_>::vector(__return_storage_ptr__);
  uVar1 = local_20;
  sVar2 = std::
          vector<std::vector<char8_t,_std::allocator<char8_t>_>,_std::allocator<std::vector<char8_t,_std::allocator<char8_t>_>_>_>
          ::size(&this->m_tokens);
  if (uVar1 < sVar2) {
    pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       (&this->m_token_indexes,local_20);
    local_30 = *pvVar3;
    local_40._M_current =
         (char8_t *)std::vector<char8_t,_std::allocator<char8_t>_>::end(__return_storage_ptr__);
    __gnu_cxx::__normal_iterator<char8_t_const*,std::vector<char8_t,std::allocator<char8_t>>>::
    __normal_iterator<char8_t*>
              ((__normal_iterator<char8_t_const*,std::vector<char8_t,std::allocator<char8_t>>> *)
               &local_38,&local_40);
    local_50._M_current =
         (char8_t *)std::vector<char8_t,_std::allocator<char8_t>_>::begin(&this->m_str);
    local_48 = __gnu_cxx::
               __normal_iterator<char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_>::
               operator+(&local_50,local_30);
    __last = std::vector<char8_t,_std::allocator<char8_t>_>::end(&this->m_str);
    std::vector<char8_t,std::allocator<char8_t>>::
    insert<__gnu_cxx::__normal_iterator<char8_t*,std::vector<char8_t,std::allocator<char8_t>>>,void>
              ((vector<char8_t,std::allocator<char8_t>> *)__return_storage_ptr__,local_38,local_48,
               (__normal_iterator<char8_t_*,_std::vector<char8_t,_std::allocator<char8_t>_>_>)
               __last._M_current);
  }
  return __return_storage_ptr__;
}

Assistant:

StringT get_remainder(size_t in_times_split) {
		StringT result;
		if (in_times_split < m_tokens.size()) {
			auto index = m_token_indexes[in_times_split];
			result.insert(result.end(), m_str.begin() + index, m_str.end());
		}

		return result;
	}